

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate.cpp
# Opt level: O3

void __thiscall CaDiCaL::Internal::build_chain_for_empty(Internal *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  unsigned_long in_RAX;
  long lVar4;
  iterator iVar5;
  Clause *__args;
  uint64_t id;
  unsigned_long local_38;
  
  if (this->lrat == true) {
    iVar5._M_current =
         (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if ((this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start == iVar5._M_current) {
      __args = this->conflict;
      iVar1 = __args->size;
      local_38 = in_RAX;
      if ((long)iVar1 != 0) {
        lVar4 = 0;
        do {
          uVar2 = *(uint *)((long)&__args[1].field_0 + lVar4);
          uVar3 = uVar2;
          if ((int)uVar2 < 1) {
            uVar3 = -uVar2;
          }
          local_38 = (this->unit_clauses_idx).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)(uVar3 << 1 | -uVar2 >> 0x1f)];
          iVar5._M_current =
               (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->lrat_chain,
                       iVar5,&local_38);
          }
          else {
            *iVar5._M_current = local_38;
            (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          lVar4 = lVar4 + 4;
        } while ((long)iVar1 * 4 != lVar4);
        __args = this->conflict;
        iVar5._M_current =
             (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
      }
      if (iVar5._M_current ==
          (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->lrat_chain,iVar5,
                   (unsigned_long *)__args);
      }
      else {
        *iVar5._M_current = (unsigned_long)__args->field_0;
        (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
    }
  }
  return;
}

Assistant:

void Internal::build_chain_for_empty () {
  if (!lrat || !lrat_chain.empty ())
    return;
  assert (!level);
  assert (lrat_chain.empty ());
  assert (conflict);
  LOG (conflict, "lrat for global empty clause with conflict");
  for (auto &lit : *conflict) {
    assert (val (lit) < 0);
    const unsigned uidx = vlit (-lit);
    uint64_t id = unit_clauses (uidx);
    lrat_chain.push_back (id);
  }
  lrat_chain.push_back (conflict->id);
}